

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intialize.c
# Opt level: O0

void WebRtcIsac_InitPostFilterbank(PostFiltBankstr *postfiltdata)

{
  int local_14;
  int k;
  PostFiltBankstr *postfiltdata_local;
  
  for (local_14 = 0; local_14 < 6; local_14 = local_14 + 1) {
    postfiltdata->STATE_0_LOWER[local_14] = 0.0;
    postfiltdata->STATE_0_UPPER[local_14] = 0.0;
    postfiltdata->STATE_0_LOWER_float[local_14] = 0.0;
    postfiltdata->STATE_0_UPPER_float[local_14] = 0.0;
  }
  postfiltdata->HPstates1[0] = 0.0;
  postfiltdata->HPstates1[1] = 0.0;
  postfiltdata->HPstates2[0] = 0.0;
  postfiltdata->HPstates2[1] = 0.0;
  postfiltdata->HPstates1_float[0] = 0.0;
  postfiltdata->HPstates1_float[1] = 0.0;
  postfiltdata->HPstates2_float[0] = 0.0;
  postfiltdata->HPstates2_float[1] = 0.0;
  return;
}

Assistant:

void WebRtcIsac_InitPostFilterbank(PostFiltBankstr *postfiltdata)
{
  int k;

  for (k = 0; k < 2*POSTQORDER; k++) {
    postfiltdata->STATE_0_LOWER[k] = 0;
    postfiltdata->STATE_0_UPPER[k] = 0;

    postfiltdata->STATE_0_LOWER_float[k] = 0;
    postfiltdata->STATE_0_UPPER_float[k] = 0;
  }

  /* High pass filter states */
  postfiltdata->HPstates1[0] = 0.0;
  postfiltdata->HPstates1[1] = 0.0;

  postfiltdata->HPstates2[0] = 0.0;
  postfiltdata->HPstates2[1] = 0.0;

  postfiltdata->HPstates1_float[0] = 0.0f;
  postfiltdata->HPstates1_float[1] = 0.0f;

  postfiltdata->HPstates2_float[0] = 0.0f;
  postfiltdata->HPstates2_float[1] = 0.0f;

  return;
}